

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O3

int ZXing::QRCode::MaskUtil::CalculateMaskPenalty(TritMatrix *matrix)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  pointer pTVar5;
  pointer pTVar6;
  long lVar7;
  value_t vVar8;
  pointer pTVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  pointer pTVar13;
  long lVar14;
  pointer pTVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  pointer pTVar19;
  ulong uVar20;
  bool bVar21;
  char local_ac [4];
  ulong local_a8;
  TritMatrix *local_a0;
  int local_98;
  int local_94;
  long local_90;
  long local_88;
  pointer local_80;
  ulong local_78;
  long local_70;
  long local_68;
  pointer local_60;
  pointer local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_94 = ApplyMaskPenaltyRule1Internal(matrix,true);
  uVar17 = 0;
  local_98 = ApplyMaskPenaltyRule1Internal(matrix,false);
  iVar1 = matrix->_height;
  local_90 = (long)iVar1;
  local_a0 = matrix;
  uVar2 = matrix->_width;
  uVar4 = (ulong)uVar2;
  lVar10 = (long)(int)uVar2;
  if (1 < local_90) {
    pTVar19 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = 0;
    iVar18 = 0;
    do {
      if (1 < (int)uVar2) {
        lVar7 = (uVar17 + 1) * uVar4;
        uVar20 = 0;
        vVar8 = pTVar19[uVar17 * uVar4].value;
        do {
          lVar12 = uVar20 + uVar17 * uVar4 + 1;
          if (((pTVar19[lVar12].value == true_v) == (vVar8 == true_v)) &&
             ((pTVar19[uVar20 + lVar7].value == true_v) == (vVar8 == true_v))) {
            iVar18 = iVar18 + (uint)((pTVar19[uVar20 + lVar7 + 1].value != true_v) !=
                                    (vVar8 == true_v));
          }
          uVar20 = uVar20 + 1;
          vVar8 = pTVar19[lVar12].value;
        } while (uVar2 - 1 != uVar20);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != iVar1 - 1);
    uVar17 = (ulong)(uint)(iVar18 * 3);
  }
  local_ac[0] = '\0';
  local_ac[1] = '\0';
  local_ac[2] = '\0';
  local_ac[3] = '\0';
  if (iVar1 < 1) {
    local_80 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
    iVar18 = 0;
  }
  else {
    local_78 = uVar17;
    local_80 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_48 = lVar10 * 7;
    local_40 = (long)(int)(uVar2 - 7);
    lVar7 = 0;
    local_a8 = 0;
    local_88 = local_90 + -7;
    local_68 = local_90;
    local_60 = local_80;
    local_58 = local_80;
    do {
      pTVar19 = local_58 + uVar4;
      local_58 = pTVar19;
      if (0 < (int)uVar2) {
        local_38 = lVar7 * uVar4;
        uVar3 = 4;
        if ((uint)lVar7 < 4) {
          uVar3 = (uint)lVar7;
        }
        local_50 = (long)(int)-(uVar3 * uVar2);
        local_68 = local_68 - lVar7;
        iVar18 = 0xb;
        if ((int)local_68 < 0xb) {
          iVar18 = (int)local_68;
        }
        local_70 = (long)(int)((iVar18 + -7) * uVar2);
        uVar20 = 0;
        pTVar9 = local_60;
LAB_0018d156:
        pTVar5 = local_80 + uVar20 + lVar7 * uVar4;
        if ((long)uVar20 <= (long)(int)(uVar2 - 7)) {
          pTVar6 = pTVar5 + 7;
          lVar12 = 0;
          do {
            if ((bool)(&DAT_001a0f5c)[lVar12] != (pTVar9[lVar12].value == true_v))
            goto LAB_0018d262;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 7);
          uVar11 = 4;
          if ((uint)uVar20 < 4) {
            uVar11 = (uint)uVar20;
          }
          pTVar13 = pTVar5 + (int)-uVar11;
          pTVar15 = pTVar5;
          if (uVar20 != 0) {
            pTVar13 = pTVar5;
            pTVar15 = pTVar5 + (int)-uVar11;
          }
          if (pTVar15 < pTVar13) {
            lVar12 = 0;
            while ((bool)local_ac[lVar12] == (pTVar15[lVar12].value == true_v)) {
              if ((pTVar13 <= pTVar15 + lVar12 + 1) ||
                 (bVar21 = lVar12 == 3, lVar12 = lVar12 + 1, bVar21)) goto LAB_0018d24c;
            }
            iVar16 = (int)(lVar10 - uVar20);
            iVar18 = 0xb;
            if (iVar16 < 0xb) {
              iVar18 = iVar16;
            }
            pTVar15 = pTVar6 + (long)iVar18 + -7;
            if ((long)(lVar10 - uVar20) < 7) {
              pTVar15 = pTVar6;
              pTVar6 = pTVar6 + (long)iVar18 + -7;
            }
            if (pTVar6 < pTVar15) {
              lVar12 = 0;
              goto LAB_0018d226;
            }
          }
          goto LAB_0018d24c;
        }
        goto LAB_0018d262;
      }
LAB_0018d345:
      lVar7 = lVar7 + 1;
      local_60 = local_60 + uVar4;
      local_68 = local_90;
    } while (lVar7 != local_90);
    iVar18 = (int)local_a8 * 0x28;
  }
  if (uVar2 * iVar1 == 0) {
    lVar10 = 0;
  }
  else {
    lVar7 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + (ulong)(local_80[lVar7].value == true_v);
      lVar7 = lVar7 + 1;
    } while ((int)(uVar2 * iVar1) != lVar7);
    lVar10 = lVar10 * 2;
  }
  lVar12 = (long)(*(int *)&(matrix->_data).
                           super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
                           super__Vector_impl_data._M_finish - (int)local_80);
  lVar10 = lVar10 - lVar12;
  lVar7 = -lVar10;
  if (0 < lVar10) {
    lVar7 = lVar10;
  }
  return (int)uVar17 + iVar18 + local_98 + local_94 + (int)((lVar7 * 10) / lVar12) * 10;
  while ((pTVar6 + lVar12 + 1 < pTVar15 && (bVar21 = lVar12 != 3, lVar12 = lVar12 + 1, bVar21))) {
LAB_0018d226:
    if ((bool)local_ac[lVar12] != (pTVar6[lVar12].value == true_v)) goto LAB_0018d262;
  }
LAB_0018d24c:
  local_a8 = (ulong)((int)local_a8 + 1);
LAB_0018d262:
  if (local_90 + -7 < lVar7) goto LAB_0018d333;
  pTVar6 = pTVar5 + lVar10 * 7;
  lVar14 = 0;
  lVar12 = 0;
  do {
    if ((bool)(&DAT_001a0f5c)[lVar12] != (pTVar9[lVar14].value == true_v)) goto LAB_0018d333;
    if (pTVar6 <= pTVar19 + lVar14) break;
    lVar14 = lVar14 + uVar4;
    bVar21 = lVar12 != 6;
    lVar12 = lVar12 + 1;
  } while (bVar21);
  pTVar15 = pTVar5 + (int)-(uVar3 * uVar2);
  if (lVar7 == 0) {
    pTVar5 = pTVar15;
    pTVar15 = local_80 + uVar20;
  }
  if (pTVar15 < pTVar5) {
    lVar12 = 0;
    while ((bool)local_ac[lVar12] == (pTVar15->value == true_v)) {
      pTVar15 = pTVar15 + lVar10;
      if ((pTVar5 <= pTVar15) || (bVar21 = lVar12 == 3, lVar12 = lVar12 + 1, bVar21))
      goto LAB_0018d327;
    }
    pTVar5 = pTVar6 + local_70;
    if (local_68 < 7) {
      pTVar5 = pTVar6;
      pTVar6 = pTVar6 + local_70;
    }
    if (pTVar6 < pTVar5) {
      lVar12 = 0;
      goto LAB_0018d304;
    }
  }
LAB_0018d327:
  local_a8 = (ulong)((int)local_a8 + 1);
LAB_0018d333:
  uVar20 = uVar20 + 1;
  pTVar9 = pTVar9 + 1;
  pTVar19 = pTVar19 + 1;
  if (uVar20 == uVar4) goto LAB_0018d345;
  goto LAB_0018d156;
  while ((pTVar6 = pTVar6 + lVar10, pTVar6 < pTVar5 &&
         (bVar21 = lVar12 != 3, lVar12 = lVar12 + 1, bVar21))) {
LAB_0018d304:
    if ((bool)local_ac[lVar12] != (pTVar6->value == true_v)) goto LAB_0018d333;
  }
  goto LAB_0018d327;
}

Assistant:

int CalculateMaskPenalty(const TritMatrix& matrix)
{
	return MaskUtil::ApplyMaskPenaltyRule1(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule2(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule3(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule4(matrix);
}